

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_scroller.c
# Opt level: O0

void draw_background(void)

{
  int iVar1;
  int iVar2;
  int y;
  int x;
  int dy;
  int dx;
  undefined4 local_10;
  undefined4 local_c;
  
  iVar1 = al_get_bitmap_width(tile);
  iVar2 = al_get_bitmap_height(tile);
  for (; 0 < offx; offx = offx - iVar1) {
  }
  for (; 0 < offy; offy = offy - iVar2) {
  }
  for (local_10 = offy; local_10 < screen_height; local_10 = iVar2 + local_10) {
    for (local_c = offx; local_c < screen_width; local_c = iVar1 + local_c) {
      al_draw_bitmap((float)local_c,(float)local_10,tile,0);
    }
  }
  return;
}

Assistant:

void draw_background(void)
{
   int dx = al_get_bitmap_width(tile);
   int dy = al_get_bitmap_height(tile);
   int x, y;

   while (offx > 0)
      offx -= dx;
   while (offy > 0)
      offy -= dy;

   for (y = offy; y < screen_height; y += dy) {
      for (x = offx; x < screen_width; x += dx) {
         al_draw_bitmap(tile, x, y, 0);
      }
   }
}